

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenu::internalDelayedPopup(QMenu *this)

{
  QMenuPrivate *this_00;
  Data *pDVar1;
  int *piVar2;
  char cVar3;
  int iVar4;
  LayoutDirection LVar5;
  long lVar6;
  QObject *pQVar7;
  Data *pDVar8;
  undefined8 uVar9;
  QMenu *pQVar10;
  QGraphicsProxyWidget *pQVar11;
  QScreen *screen;
  QStyle *pQVar12;
  Representation RVar13;
  int iVar14;
  long in_FS_OFFSET;
  QRect QVar15;
  QRect QVar16;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 local_68 [8];
  QAction **local_60;
  long local_58;
  QPoint local_50;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  pDVar8 = (this_00->activeMenu).wp.d;
  if ((((pDVar8 != (Data *)0x0) && (*(int *)(pDVar8 + 4) != 0)) &&
      (pQVar7 = (this_00->activeMenu).wp.value, pQVar7 != (QObject *)0x0)) &&
     (*(QAction **)(*(long *)(pQVar7 + 8) + 0x3a8) != this_00->currentAction)) {
    QMenuPrivate::hideMenu(this_00,(QMenu *)pQVar7);
  }
  if ((this_00->currentAction != (QAction *)0x0) && (cVar3 = QAction::isEnabled(), cVar3 != '\0')) {
    QAction::menuObject();
    lVar6 = QMetaObject::cast((QObject *)&staticMetaObject);
    if (lVar6 != 0) {
      QAction::menuObject();
      lVar6 = QMetaObject::cast((QObject *)&staticMetaObject);
      if ((*(byte *)(*(long *)(lVar6 + 0x20) + 8) & 1) == 0) {
        QAction::menuObject();
        lVar6 = QMetaObject::cast((QObject *)&staticMetaObject);
        if ((*(byte *)(*(long *)(lVar6 + 0x20) + 9) & 0x80) == 0) {
          QAction::menuObject();
          pQVar7 = (QObject *)QMetaObject::cast((QObject *)&staticMetaObject);
          if (pQVar7 == (QObject *)0x0) {
            pDVar8 = (Data *)0x0;
          }
          else {
            pDVar8 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar7);
          }
          pDVar1 = (this_00->activeMenu).wp.d;
          (this_00->activeMenu).wp.d = pDVar8;
          (this_00->activeMenu).wp.value = pQVar7;
          if (pDVar1 != (Data *)0x0) {
            LOCK();
            *(int *)pDVar1 = *(int *)pDVar1 + -1;
            UNLOCK();
            if (*(int *)pDVar1 == 0) {
              operator_delete(pDVar1);
            }
            pQVar7 = (this_00->activeMenu).wp.value;
          }
          lVar6 = *(long *)(pQVar7 + 8);
          uVar9 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
          piVar2 = *(int **)(lVar6 + 0x2f8);
          *(undefined8 *)(lVar6 + 0x2f8) = uVar9;
          *(QMenu **)(lVar6 + 0x300) = this;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              operator_delete(piVar2);
            }
          }
          pQVar7 = (QObject *)this_00->currentAction;
          lVar6 = *(long *)((this_00->activeMenu).wp.value + 8);
          if (pQVar7 == (QObject *)0x0) {
            uVar9 = 0;
          }
          else {
            uVar9 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar7);
          }
          piVar2 = *(int **)(lVar6 + 0x308);
          *(undefined8 *)(lVar6 + 0x308) = uVar9;
          *(QObject **)(lVar6 + 0x310) = pQVar7;
          pQVar10 = this;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              operator_delete(piVar2);
            }
          }
          do {
            if (((((pQVar10->super_QWidget).data)->window_flags).
                 super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i
                & 0x20000000) != 0) goto LAB_00456972;
            pQVar10 = *(QMenu **)(*(long *)&(pQVar10->super_QWidget).field_0x8 + 0x10);
          } while (pQVar10 != (QMenu *)0x0);
          pQVar11 = QWidgetPrivate::nearestGraphicsProxyWidget(&this->super_QWidget);
          if (pQVar11 == (QGraphicsProxyWidget *)0x0) {
LAB_00456972:
            local_68 = (undefined1  [8])QWidget::pos(&this->super_QWidget);
            screen = (QScreen *)QGuiApplication::screenAt((QPoint *)local_68);
          }
          else {
            screen = (QScreen *)0x0;
          }
          QVar15 = QMenuPrivate::popupGeometry(this_00,screen);
          pQVar12 = QWidget::style(&this->super_QWidget);
          iVar4 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x57,0,this);
          QVar16 = QMenuPrivate::actionRect(this_00,this_00->currentAction);
          local_48 = QVar16;
          LVar5 = QWidget::layoutDirection(&this->super_QWidget);
          iVar14 = (QVar16.x1.m_i.m_i - iVar4) - QVar16.x2.m_i;
          if (LVar5 != RightToLeft) {
            iVar14 = iVar4;
          }
          local_68._4_4_ = (int)QVar16.y1.m_i;
          local_68._0_4_ = iVar14 + QVar16.x2.m_i.m_i;
          local_50 = QWidget::mapToGlobal(&this->super_QWidget,(QPoint *)local_68);
          RVar13 = local_50.yp.m_i;
          if (QVar15.x2.m_i.m_i < local_50.xp.m_i.m_i) {
            local_50.yp.m_i = RVar13.m_i;
            local_50.xp.m_i = (((this->super_QWidget).data)->crect).x1.m_i;
          }
          QWidget::actions((QList<QAction_*> *)local_68,(QWidget *)(this_00->activeMenu).wp.value);
          if (local_58 != 0) {
            QVar15 = QMenuPrivate::actionRect
                               (*(QMenuPrivate **)((this_00->activeMenu).wp.value + 8),*local_60);
            local_50.yp.m_i = RVar13.m_i - QVar15.y1.m_i;
          }
          pQVar7 = (QObject *)0x0;
          popup((QMenu *)(this_00->activeMenu).wp.value,&local_50,(QAction *)0x0);
          pDVar8 = (this_00->activeMenu).wp.d;
          if (pDVar8 != (Data *)0x0) {
            if (*(int *)(pDVar8 + 4) == 0) {
              pQVar7 = (QObject *)0x0;
            }
            else {
              pQVar7 = (this_00->activeMenu).wp.value;
            }
          }
          QMenuSloppyState::setSubMenuPopup
                    (&this_00->sloppyState,&local_48,this_00->currentAction,(QMenu *)pQVar7);
          if ((((this->super_QWidget).data)->widget_attributes & 2) != 0) {
            local_78 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
            QEvent::QEvent((QEvent *)&local_78,Leave);
            QCoreApplication::sendEvent((QObject *)this,(QEvent *)&local_78);
            QEvent::~QEvent((QEvent *)&local_78);
          }
          if ((QPoint)local_68 != (QPoint)0x0) {
            LOCK();
            *(int *)local_68 = *(int *)local_68 + -1;
            UNLOCK();
            if (*(int *)local_68 == 0) {
              QArrayData::deallocate((QArrayData *)local_68,8,0x10);
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenu::internalDelayedPopup()
{
    Q_D(QMenu);
    //hide the current item
    if (QMenu *menu = d->activeMenu) {
        if (d->activeMenu->menuAction() != d->currentAction)
            d->hideMenu(menu);
    }

    if (!d->currentAction || !d->currentAction->isEnabled() || !d->currentAction->menu() ||
        !d->currentAction->menu()->isEnabled() || d->currentAction->menu()->isVisible())
        return;

    //setup
    d->activeMenu = d->currentAction->menu();
    d->activeMenu->d_func()->causedPopup.widget = this;
    d->activeMenu->d_func()->causedPopup.action = d->currentAction;

    QRect screen;
#if QT_CONFIG(graphicsview)
    bool isEmbedded = !bypassGraphicsProxyWidget(this) && QMenuPrivate::nearestGraphicsProxyWidget(this);
    if (isEmbedded)
        screen = d->popupGeometry();
    else
#endif
    screen = d->popupGeometry(QGuiApplication::screenAt(pos()));

    int subMenuOffset = style()->pixelMetric(QStyle::PM_SubMenuOverlap, nullptr, this);
    const QRect actionRect(d->actionRect(d->currentAction));
    const auto ofs = isRightToLeft() ? (-subMenuOffset - actionRect.width() + 1) : subMenuOffset;
    QPoint subMenuPos(mapToGlobal(QPoint(actionRect.right() + ofs, actionRect.top())));
    if (subMenuPos.x() > screen.right())
        subMenuPos.setX(geometry().left());

    const auto &subMenuActions = d->activeMenu->actions();
    if (!subMenuActions.isEmpty()) {
        // Offset by the submenu's 1st action position to align with the current action
        const auto subMenuActionRect = d->activeMenu->actionGeometry(subMenuActions.first());
        subMenuPos.ry() -= subMenuActionRect.top();
    }

    d->activeMenu->popup(subMenuPos);
    d->sloppyState.setSubMenuPopup(actionRect, d->currentAction, d->activeMenu);

#if !defined(Q_OS_DARWIN)
    // Send the leave event to the current menu - only active popup menu gets
    // mouse enter/leave events. Currently Cocoa is an exception, so disable
    // it there to avoid event duplication.
    if (underMouse()) {
        QEvent leaveEvent(QEvent::Leave);
        QCoreApplication::sendEvent(this, &leaveEvent);
    }
#endif
}